

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool_test.cc
# Opt level: O2

void __thiscall TokenPoolTestMonitorFD::Run(TokenPoolTestMonitorFD *this)

{
  int iVar1;
  Test *this_00;
  bool bVar2;
  int iVar3;
  
  anon_unknown.dwarf_117da6::TokenPoolTest::CreateDefaultPool(&this->super_TokenPoolTest);
  bVar2 = testing::Test::Check
                    (g_current_test,(this->super_TokenPoolTest).tokens_ != (TokenPool *)0x0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/tokenpool_test.cc"
                     ,0xa5,"__null != tokens_");
  if (bVar2) {
    testing::Test::Check
              (g_current_test,(bool)(-((this->super_TokenPoolTest).load_avg_ == -1.23456789) & 1),
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/tokenpool_test.cc"
               ,0xa6,"kLoadAverageDefault == load_avg_");
    this_00 = g_current_test;
    iVar1 = (this->super_TokenPoolTest).fds_[0];
    iVar3 = (*((this->super_TokenPoolTest).tokens_)->_vptr_TokenPool[7])();
    testing::Test::Check
              (this_00,iVar1 == iVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/tokenpool_test.cc"
               ,0xa8,"fds_[0] == tokens_->GetMonitorFd()");
    return;
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  return;
}

Assistant:

TEST_F(TokenPoolTest, MonitorFD) {
  CreateDefaultPool();

  ASSERT_NE(NULL, tokens_);
  EXPECT_EQ(kLoadAverageDefault, load_avg_);

  EXPECT_EQ(fds_[0], tokens_->GetMonitorFd());
}